

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O0

void CheckStackTraceLeaf(void)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void **ppvVar4;
  void *__ptr;
  _Check_string *unaff_retaddr;
  uint local_264;
  int i_1;
  anon_union_8_2_f9eccfc2 p;
  int i;
  char **strings;
  LogMessage local_240;
  string *local_1e0;
  _Check_string *_result_1;
  LogMessage local_1d0;
  string *local_170;
  _Check_string *_result;
  LogMessage local_160;
  string *local_100;
  _Check_string *_result_3;
  CheckOpString local_e8;
  LogMessage local_e0;
  string *local_80;
  _Check_string *_result_2;
  void *ra;
  int size;
  void *stack [10];
  int STACK_LEN;
  
  _result_2 = unaff_retaddr;
  ppvVar3 = google::GetReferenceableValue<void_const*>(&expected_range[1].start);
  ppvVar4 = google::GetReferenceableValue<void*>(&_result_2);
  local_80 = google::Check_LTImpl<void_const*,void*>
                       (ppvVar3,ppvVar4,"(&expected_range[1])->start < ra");
  if (local_80 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_e8,local_80);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0x84,&local_e8);
    google::LogMessage::stream(&local_e0);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e0);
  }
  if (expected_range[1].end < _result_2) {
    printf("Adjusting range from %p..%p to %p..%p\n",expected_range[1].start,expected_range[1].end,
           expected_range[1].start,_result_2);
    expected_range[1].end = _result_2;
  }
  expected_range[0].start = (void *)0x10bbf5;
  expected_range[0].end = (void *)0x10beed;
  ppvVar3 = google::GetReferenceableValue<void_const*>(&expected_range[0].start);
  ppvVar4 = google::GetReferenceableValue<void_const*>(&expected_range[0].end);
  local_100 = google::Check_LTImpl<void_const*,void_const*>
                        (ppvVar3,ppvVar4,"(&expected_range[0])->start < (&expected_range[0])->end");
  if (local_100 != (string *)0x0) {
    google::CheckOpString::CheckOpString((CheckOpString *)&_result,local_100);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0x85,(CheckOpString *)&_result);
    google::LogMessage::stream(&local_160);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_160);
  }
  ra._4_4_ = google::GetStackTrace((void **)&stack0xffffffffffffff98,10,0);
  printf("Obtained %d stack frames.\n",(ulong)ra._4_4_);
  iVar1 = google::GetReferenceableValue(ra._4_4_);
  iVar2 = google::GetReferenceableValue(1);
  local_170 = google::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"size >= 1");
  if (local_170 != (string *)0x0) {
    google::CheckOpString::CheckOpString((CheckOpString *)&_result_1,local_170);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0x89,(CheckOpString *)&_result_1);
    google::LogMessage::stream(&local_1d0);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d0);
  }
  iVar1 = google::GetReferenceableValue(ra._4_4_);
  iVar2 = google::GetReferenceableValue(10);
  local_1e0 = google::Check_LEImpl_abi_cxx11_(iVar1,iVar2,"size <= STACK_LEN");
  if (local_1e0 != (string *)0x0) {
    google::CheckOpString::CheckOpString((CheckOpString *)&strings,local_1e0);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0x8a,(CheckOpString *)&strings);
    google::LogMessage::stream(&local_240);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_240);
  }
  __ptr = (void *)backtrace_symbols(&stack0xffffffffffffff98,ra._4_4_);
  printf("Obtained %d stack frames.\n",(ulong)ra._4_4_);
  for (p._4_4_ = 0; (int)p._4_4_ < (int)ra._4_4_; p._4_4_ = p._4_4_ + 1) {
    printf("%s %p\n",*(undefined8 *)((long)__ptr + (long)(int)p._4_4_ * 8),
           *(undefined8 *)(&stack0xffffffffffffff98 + (long)(int)p._4_4_ * 8));
  }
  printf("CheckStackTrace() addr: %p\n",CheckStackTrace);
  free(__ptr);
  for (local_264 = 0; (int)local_264 < 6; local_264 = local_264 + 1) {
    printf("Backtrace %d: expected: %p..%p  actual: %p ... ",(ulong)local_264,
           expected_range[(int)local_264].start,expected_range[(int)local_264].end,
           *(undefined8 *)(&stack0xffffffffffffff98 + (long)(int)local_264 * 8));
    fflush(_stdout);
    CheckRetAddrIsInFunction
              (*(void **)(&stack0xffffffffffffff98 + (long)(int)local_264 * 8),
               expected_range + (int)local_264);
    printf("OK\n");
  }
  return;
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTraceLeaf() {
  const int STACK_LEN = 10;
  void* stack[STACK_LEN];
  int size;

  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[1]);
  INIT_ADDRESS_RANGE(CheckStackTraceLeaf, start, end, &expected_range[0]);
  DECLARE_ADDRESS_LABEL(start);
  size = GetStackTrace(stack, STACK_LEN, 0);
  printf("Obtained %d stack frames.\n", size);
  CHECK_GE(size, 1);
  CHECK_LE(size, STACK_LEN);

  if (true) {
#  ifdef HAVE_EXECINFO_BACKTRACE_SYMBOLS
    char** strings = backtrace_symbols(stack, size);
    printf("Obtained %d stack frames.\n", size);
    for (int i = 0; i < size; i++) {
      printf("%s %p\n", strings[i], stack[i]);
    }

    union {
      void (*p1)(int);
      void* p2;
    } p = {&CheckStackTrace};

    printf("CheckStackTrace() addr: %p\n", p.p2);
    free(strings);
#  endif
  }
  for (int i = 0; i < BACKTRACE_STEPS; i++) {
    printf("Backtrace %d: expected: %p..%p  actual: %p ... ", i,
           expected_range[i].start, expected_range[i].end, stack[i]);
    fflush(stdout);
    CheckRetAddrIsInFunction(stack[i], expected_range[i]);
    printf("OK\n");
  }
  DECLARE_ADDRESS_LABEL(end);
}